

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::clearDualBounds(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Status stat,
                 number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *upp,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *lw)

{
  double a;
  uint uVar1;
  long in_FS_OFFSET;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined5 uStack_40;
  undefined3 uStack_3b;
  int iStack_38;
  bool bStack_34;
  undefined8 local_30;
  
  uVar1 = stat + D_ON_BOTH;
  if (uVar1 < 0xb) {
    if ((0x81U >> (uVar1 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar1 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar1 & 0x1f) & 1) == 0) {
          return;
        }
        ::soplex::infinity::__tls_init();
        local_30 = 0x1000000000;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        uStack_3b = 0;
        iStack_38 = 0;
        bStack_34 = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_78,*(double *)(in_FS_OFFSET + -8));
        *(undefined8 *)(upp->m_backend).data._M_elems = local_78;
        *(undefined8 *)((upp->m_backend).data._M_elems + 2) = uStack_70;
        *(undefined8 *)((upp->m_backend).data._M_elems + 4) = local_68;
        *(undefined8 *)((upp->m_backend).data._M_elems + 6) = uStack_60;
        *(undefined8 *)((upp->m_backend).data._M_elems + 8) = local_58;
        *(undefined8 *)((upp->m_backend).data._M_elems + 10) = uStack_50;
        *(undefined8 *)((upp->m_backend).data._M_elems + 0xc) = local_48;
        *(ulong *)((upp->m_backend).data._M_elems + 0xe) = CONCAT35(uStack_3b,uStack_40);
        (upp->m_backend).exp = iStack_38;
        (upp->m_backend).neg = bStack_34;
        (upp->m_backend).fpclass = (undefined4)local_30;
        (upp->m_backend).prec_elem = local_30._4_4_;
        return;
      }
      ::soplex::infinity::__tls_init();
      local_88 = (undefined4)*(undefined8 *)(in_FS_OFFSET + -8);
      uStack_84 = (undefined4)((ulong)*(undefined8 *)(in_FS_OFFSET + -8) >> 0x20);
    }
    else {
      ::soplex::infinity::__tls_init();
      a = *(double *)(in_FS_OFFSET + -8);
      local_30 = 0x1000000000;
      local_78 = 0;
      uStack_70 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_48 = 0;
      uStack_40 = 0;
      uStack_3b = 0;
      iStack_38 = 0;
      bStack_34 = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_78,a);
      *(undefined8 *)(upp->m_backend).data._M_elems = local_78;
      *(undefined8 *)((upp->m_backend).data._M_elems + 2) = uStack_70;
      *(undefined8 *)((upp->m_backend).data._M_elems + 4) = local_68;
      *(undefined8 *)((upp->m_backend).data._M_elems + 6) = uStack_60;
      *(undefined8 *)((upp->m_backend).data._M_elems + 8) = local_58;
      *(undefined8 *)((upp->m_backend).data._M_elems + 10) = uStack_50;
      *(undefined8 *)((upp->m_backend).data._M_elems + 0xc) = local_48;
      *(ulong *)((upp->m_backend).data._M_elems + 0xe) = CONCAT35(uStack_3b,uStack_40);
      (upp->m_backend).exp = iStack_38;
      (upp->m_backend).neg = bStack_34;
      (upp->m_backend).fpclass = (undefined4)local_30;
      (upp->m_backend).prec_elem = local_30._4_4_;
      ::soplex::infinity::__tls_init();
      local_88 = SUB84(a,0);
      uStack_84 = (undefined4)((ulong)a >> 0x20);
    }
    local_30 = 0x1000000000;
    local_78 = 0;
    uStack_70 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_3b = 0;
    iStack_38 = 0;
    bStack_34 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_78,-(double)CONCAT44(uStack_84,local_88));
    *(undefined8 *)(lw->m_backend).data._M_elems = local_78;
    *(undefined8 *)((lw->m_backend).data._M_elems + 2) = uStack_70;
    *(undefined8 *)((lw->m_backend).data._M_elems + 4) = local_68;
    *(undefined8 *)((lw->m_backend).data._M_elems + 6) = uStack_60;
    *(undefined8 *)((lw->m_backend).data._M_elems + 8) = local_58;
    *(undefined8 *)((lw->m_backend).data._M_elems + 10) = uStack_50;
    *(undefined8 *)((lw->m_backend).data._M_elems + 0xc) = local_48;
    *(ulong *)((lw->m_backend).data._M_elems + 0xe) = CONCAT35(uStack_3b,uStack_40);
    (lw->m_backend).exp = iStack_38;
    (lw->m_backend).neg = bStack_34;
    (lw->m_backend).fpclass = (undefined4)local_30;
    (lw->m_backend).prec_elem = local_30._4_4_;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}